

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Function_Type.cxx
# Opt level: O2

int __thiscall Fl_Class_Type::has_function(Fl_Class_Type *this,char *rtype,char *sig)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  Fl_Function_Type *fn;
  Fl_Class_Type *this_00;
  
  this_00 = this;
  while( true ) {
    this_00 = (Fl_Class_Type *)(this_00->super_Fl_Type).next;
    if (this_00 == (Fl_Class_Type *)0x0) {
      return 0;
    }
    iVar2 = (this_00->super_Fl_Type).level;
    iVar1 = (this->super_Fl_Type).level;
    if (iVar2 <= iVar1) break;
    if (iVar2 == iVar1 + 1) {
      iVar2 = (*(this_00->super_Fl_Type)._vptr_Fl_Type[5])(this_00);
      iVar2 = strcmp((char *)CONCAT44(extraout_var,iVar2),"Function");
      if ((iVar2 == 0) &&
         (iVar2 = Fl_Function_Type::has_signature((Fl_Function_Type *)this_00,rtype,sig), iVar2 != 0
         )) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

int Fl_Class_Type::has_function(const char *rtype, const char *sig) const {
  Fl_Type *child;
  for (child = next; child && child->level > level; child = child->next) {
    if (child->level == level+1 && strcmp(child->type_name(), "Function")==0) {
      const Fl_Function_Type *fn = (const Fl_Function_Type*)child;
      if (fn->has_signature(rtype, sig))
        return 1;
    }
  }
  return 0;
}